

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

void __thiscall
PcodeOpBank::moveSequenceDead(PcodeOpBank *this,PcodeOp *firstop,PcodeOp *lastop,PcodeOp *prev)

{
  bool bVar1;
  size_t in_R9;
  list<PcodeOp_*,_std::allocator<PcodeOp_*>_> *this_00;
  _List_const_iterator<PcodeOp_*> local_50;
  _List_const_iterator<PcodeOp_*> local_48;
  _List_const_iterator<PcodeOp_*> local_40;
  _List_iterator<PcodeOp_*> local_38;
  iterator previter;
  iterator enditer;
  PcodeOp *prev_local;
  PcodeOp *lastop_local;
  PcodeOp *firstop_local;
  PcodeOpBank *this_local;
  
  previter._M_node = (lastop->insertiter)._M_node;
  std::_List_iterator<PcodeOp_*>::operator++(&previter);
  local_38._M_node = (prev->insertiter)._M_node;
  std::_List_iterator<PcodeOp_*>::operator++(&local_38);
  bVar1 = std::operator!=(&local_38,&firstop->insertiter);
  if (bVar1) {
    this_00 = &this->deadlist;
    std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_40,&local_38);
    std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_48,&firstop->insertiter);
    std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_50,&previter);
    std::__cxx11::list<PcodeOp_*,_std::allocator<PcodeOp_*>_>::splice
              (this_00,(int)local_40._M_node,(__off64_t *)&this->deadlist,(int)local_48._M_node,
               (__off64_t *)local_50._M_node,in_R9,(uint)this_00);
  }
  return;
}

Assistant:

void PcodeOpBank::moveSequenceDead(PcodeOp *firstop,PcodeOp *lastop,PcodeOp *prev)

{
  list<PcodeOp *>::iterator enditer = lastop->insertiter;
  ++enditer;
  list<PcodeOp *>::iterator previter = prev->insertiter;
  ++previter;
  if (previter != firstop->insertiter) // Check for degenerate move
    deadlist.splice(previter,deadlist,firstop->insertiter,enditer);
}